

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory.cpp
# Opt level: O0

unique_ptr<Tea,_std::default_delete<Tea>_> make_drink<Tea>(void)

{
  pointer pTVar1;
  __uniq_ptr_data<Tea,_std::default_delete<Tea>,_true,_true> in_RDI;
  __single_object *drink;
  
  std::make_unique<Tea>();
  pTVar1 = std::unique_ptr<Tea,_std::default_delete<Tea>_>::operator->
                     ((unique_ptr<Tea,_std::default_delete<Tea>_> *)
                      in_RDI.super___uniq_ptr_impl<Tea,_std::default_delete<Tea>_>._M_t.
                      super__Tuple_impl<0UL,_Tea_*,_std::default_delete<Tea>_>.
                      super__Head_base<0UL,_Tea_*,_false>._M_head_impl);
  (**(pTVar1->super_HotDrink)._vptr_HotDrink)(0x43480000);
  return (__uniq_ptr_data<Tea,_std::default_delete<Tea>,_true,_true>)
         (tuple<Tea_*,_std::default_delete<Tea>_>)
         in_RDI.super___uniq_ptr_impl<Tea,_std::default_delete<Tea>_>._M_t.
         super__Tuple_impl<0UL,_Tea_*,_std::default_delete<Tea>_>.
         super__Head_base<0UL,_Tea_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Drink> make_drink()
{
	static_assert(std::is_base_of_v<HotDrink, Drink>);

	auto drink{std::make_unique<Drink>()};
	if constexpr (std::is_same_v<Tea, Drink>)
	{
		drink->prepare(200);
	}
	else if constexpr (std::is_same_v<Coffee, Drink>)
	{
		drink->prepare(50);
	}

	return drink;
}